

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

Noise * __thiscall NoiseSource::createNoise(NoiseSource *this,int n,string *type)

{
  Noise *pNVar1;
  int iVar2;
  bool bVar3;
  PoissonNoise *this_00;
  ostream *poVar4;
  WienerNoise *pWVar5;
  string local_2b0 [38];
  undefined1 local_28a;
  allocator<char> local_289;
  string local_288;
  string local_268;
  undefined1 local_242;
  allocator<char> local_241;
  string local_240;
  string local_220;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream name;
  ostream local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *type_local;
  NoiseSource *pNStack_10;
  int n_local;
  NoiseSource *this_local;
  
  type_local._4_4_ = n;
  if (this->aNoises[n] == (Noise *)0x0) {
    local_20 = type;
    pNStack_10 = this;
    std::__cxx11::stringstream::stringstream(local_1a8);
    bVar3 = std::operator==(local_20,"Correlated Wiener Process");
    if (bVar3) {
      poVar4 = std::operator<<(&local_198,"Wiener process");
      poVar4 = std::operator<<(poVar4,"[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,type_local._4_4_);
      poVar4 = std::operator<<(poVar4,"]");
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      pWVar5 = (WienerNoise *)operator_new(0x180);
      iVar2 = type_local._4_4_;
      local_1fa = 1;
      std::__cxx11::stringstream::str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Correlated Wiener Process",&local_1f9);
      WienerNoise::WienerNoise(pWVar5,this,iVar2,&local_1d8,&local_1f8);
      local_1fa = 0;
      this->aNoises[type_local._4_4_] = (Noise *)pWVar5;
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      bVar3 = std::operator==(local_20,"Correlated Poisson Process");
      if (bVar3) {
        poVar4 = std::operator<<(&local_198,"Poisson process");
        poVar4 = std::operator<<(poVar4,"[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,type_local._4_4_);
        poVar4 = std::operator<<(poVar4,"]");
        std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
        this_00 = (PoissonNoise *)operator_new(0x180);
        iVar2 = type_local._4_4_;
        local_242 = 1;
        std::__cxx11::stringstream::str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240,"Correlated Poisson Process",&local_241);
        PoissonNoise::PoissonNoise(this_00,this,iVar2,&local_220,&local_240);
        local_242 = 0;
        this->aNoises[type_local._4_4_] = (Noise *)this_00;
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator(&local_241);
        std::__cxx11::string::~string((string *)&local_220);
      }
      else {
        bVar3 = std::operator==(local_20,"Correlated Ornstein-Uhlenbeck Process");
        if (bVar3) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "Ornstein-Uhlenbeck process not implemented yet.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(&local_198,"Wiener process");
          poVar4 = std::operator<<(poVar4,"[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,type_local._4_4_);
          poVar4 = std::operator<<(poVar4,"]");
          std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
          pWVar5 = (WienerNoise *)operator_new(0x180);
          iVar2 = type_local._4_4_;
          local_28a = 1;
          std::__cxx11::stringstream::str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"Correlated Wiener Process",&local_289);
          WienerNoise::WienerNoise(pWVar5,this,iVar2,&local_268,&local_288);
          local_28a = 0;
          this->aNoises[type_local._4_4_] = (Noise *)pWVar5;
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
          std::__cxx11::string::~string((string *)&local_268);
        }
      }
    }
    if (this->aNoises[type_local._4_4_] != (Noise *)0x0) {
      pNVar1 = this->aNoises[type_local._4_4_];
      std::__cxx11::stringstream::str();
      (*(pNVar1->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
        [0xc])(pNVar1,local_2b0);
      std::__cxx11::string::~string(local_2b0);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return this->aNoises[type_local._4_4_];
}

Assistant:

Noise *NoiseSource::createNoise( int n, const string &type )
{
	if( !aNoises[n] ) {
		stringstream name;
		if (type=="Correlated Wiener Process") {
			name << "Wiener process" << "[" << n << "]" << flush;
			aNoises[n] = new WienerNoise(this, n, name.str());
		}
		else if (type=="Correlated Poisson Process") {
			name << "Poisson process" << "[" << n << "]" << flush;
			aNoises[n] = new PoissonNoise(this, n, name.str());
		}
		else if (type=="Correlated Ornstein-Uhlenbeck Process") {
			cout << "Ornstein-Uhlenbeck process not implemented yet." << endl;
			name << "Wiener process" << "[" << n << "]" << flush;
			aNoises[n] = new WienerNoise(this, n, name.str());
		}
		if( aNoises[n] )
			aNoises[n]->setDescription(name.str());
	}
	 
	return aNoises[n];
}